

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O1

TValue * lj_tab_newkey(lua_State *L,GCtab *t,cTValue *key)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  ulong uVar4;
  GCobj *o;
  TValue *pTVar5;
  TValue *pTVar6;
  TValue *pTVar7;
  uint uVar8;
  uint32_t uVar9;
  TValue *pTVar10;
  
  pTVar1 = &hashkey(t,key)->val;
  if (((pTVar1->field_2).it == 0xffffffff) && (t->hmask != 0)) goto LAB_0011cc19;
  pTVar10 = (TValue *)(ulong)(t->node).ptr32;
  pTVar2 = (TValue *)(ulong)((MRef *)((long)pTVar10 + 0x14))->ptr32;
  pTVar7 = pTVar2;
  do {
    pTVar6 = pTVar7;
    if (pTVar6 == pTVar10) {
      rehashtab(L,t,key);
      pTVar2 = lj_tab_set(L,t,key);
      goto LAB_0011cc14;
    }
    pTVar7 = pTVar6 + -3;
    uVar8 = (int)pTVar2 - 0x18;
    pTVar2 = (TValue *)(ulong)uVar8;
  } while (*(int *)((long)pTVar6 + -0xc) != -1);
  ((MRef *)((long)pTVar10 + 0x14))->ptr32 = uVar8;
  pTVar2 = &hashkey(t,pTVar1 + 1)->val;
  if (pTVar2 == pTVar1) {
    pTVar2 = (TValue *)(ulong)pTVar1[2].u32.lo;
    pTVar6[-1].u32.lo = pTVar1[2].u32.lo;
    pTVar1[2].u32.lo = uVar8;
    pTVar1 = pTVar7;
  }
  else {
    do {
      pTVar5 = pTVar2;
      pTVar2 = (TValue *)(ulong)pTVar5[2].u32.lo;
    } while (pTVar1 != pTVar2);
    pTVar5[2].u32.lo = uVar8;
    pTVar7->field_2 = *(anon_struct_8_2_fd66bcdd_for_TValue_2 *)pTVar1;
    pTVar6[-2] = pTVar1[1];
    pTVar6[-1].field_2.field_0 = pTVar1[2].field_2.field_0;
    pTVar1[2].u32.lo = 0;
    (pTVar1->field_2).it = 0xffffffff;
    pTVar5 = (TValue *)(ulong)pTVar6[-1].u32.lo;
    if (*(int *)((long)pTVar1 + 0xc) == -5) {
      while (pTVar2 = pTVar5, (int)pTVar2 != 0) {
        if ((((MRef *)&(pTVar2->field_2).it)->ptr32 != 0xffffffff) &&
           (pTVar3 = &hashkey(t,pTVar2 + 1)->val, pTVar5 = pTVar2, pTVar3 == pTVar1))
        goto LAB_0011cc4a;
        pTVar7 = pTVar2;
        pTVar5 = (TValue *)(ulong)pTVar2[2].u32.lo;
      }
    }
    else {
      while (pTVar2 = pTVar5, (int)pTVar2 != 0) {
        if (((*(int *)((long)pTVar2 + 0xc) == -5) &&
            (((MRef *)&(pTVar2->field_2).it)->ptr32 != 0xffffffff)) &&
           (pTVar5 = pTVar2,
           (TValue *)
           ((ulong)(t->node).ptr32 +
           (ulong)(t->hmask & *(uint *)((ulong)pTVar2[1].u32.lo + 8)) * 0x18) == pTVar1))
        goto LAB_0011cc4a;
        pTVar7 = pTVar2;
        pTVar5 = (TValue *)(ulong)pTVar2[2].u32.lo;
      }
    }
  }
  goto LAB_0011cc14;
LAB_0011cc4a:
  pTVar7[2].field_2.field_0 = pTVar5[2].field_2.field_0;
  pTVar2 = (TValue *)(ulong)pTVar1[2].u32.lo;
  pTVar5[2].u32.lo = pTVar1[2].u32.lo;
  pTVar1[2].u32.lo = (uint32_t)pTVar5;
  uVar9 = pTVar7[2].u32.lo;
  if (uVar9 != 0) {
    pTVar2 = pTVar7 + 2;
    do {
      pTVar5 = (TValue *)(ulong)uVar9;
      if (((pTVar5->field_2).it != 0xffffffff) &&
         (pTVar3 = &hashkey(t,pTVar5 + 1)->val, pTVar3 != pTVar5 && pTVar3 != pTVar7)) {
        (((TValue *)&(pTVar2->field_2).field_0)->field_2).field_0 = pTVar5[2].field_2.field_0;
        pTVar5[2].field_2.field_0 = pTVar3[2].field_2.field_0;
        pTVar3[2].u32.lo = uVar9;
        pTVar5 = pTVar7;
      }
      pTVar2 = pTVar5 + 2;
      uVar9 = pTVar5[2].u32.lo;
      pTVar7 = pTVar5;
    } while (uVar9 != 0);
  }
LAB_0011cc14:
  if (pTVar6 == pTVar10) {
    return pTVar2;
  }
LAB_0011cc19:
  pTVar1[1] = *key;
  if ((t->marked & 4) != 0) {
    uVar4 = (ulong)(L->glref).ptr32;
    t->marked = t->marked & 0xfb;
    (t->gclist).gcptr32 = *(uint32_t *)(uVar4 + 0x6c);
    *(int *)(uVar4 + 0x6c) = (int)t;
  }
  return pTVar1;
}

Assistant:

TValue *lj_tab_newkey(lua_State *L, GCtab *t, cTValue *key)
{
  Node *n = hashkey(t, key);
  if (!tvisnil(&n->val) || t->hmask == 0) {
    Node *nodebase = noderef(t->node);
    Node *collide, *freenode = getfreetop(t, nodebase);
    lj_assertL(freenode >= nodebase && freenode <= nodebase+t->hmask+1,
	       "bad freenode");
    do {
      if (freenode == nodebase) {  /* No free node found? */
	rehashtab(L, t, key);  /* Rehash table. */
	return lj_tab_set(L, t, key);  /* Retry key insertion. */
      }
    } while (!tvisnil(&(--freenode)->key));
    setfreetop(t, nodebase, freenode);
    lj_assertL(freenode != &G(L)->nilnode, "store to fallback hash");
    collide = hashkey(t, &n->key);
    if (collide != n) {  /* Colliding node not the main node? */
      Node *nn;
      while (noderef(collide->next) != n)  /* Find predecessor. */
	collide = nextnode(collide);
      setmref(collide->next, freenode);  /* Relink chain. */
      /* Copy colliding node into free node and free main node. */
      freenode->val = n->val;
      freenode->key = n->key;
      freenode->next = n->next;
      setmref(n->next, NULL);
      setnilV(&n->val);
      /*
      ** Nodes after n might have n as their main node, and need rechaining
      ** back onto n. We make use of the following property of tables: for all
      ** nodes m, at least one of the following four statements is true:
      **  1. tvisnil(&m->key)  NB: tvisnil(&m->val) is a stronger statement
      **  2. tvisstr(&m->key)
      **  3. tvisstr(&main(m)->key)
      **  4. main(m) == main(main(m))
      ** Initially, we need to rechain any nn which has main(nn) == n. As
      ** main(n) != n (because collide != n earlier), main(nn) == n requires
      ** either statement 2 or statement 3 to be true about nn.
      */
      if (!tvisstr(&n->key)) {
	/* Statement 3 is not true, so only need to consider string keys. */
	while ((nn = nextnode(freenode))) {
	  if (tvisstr(&nn->key) && !tvisnil(&nn->val) &&
	      hashstr(t, strV(&nn->key)) == n) {
	    goto rechain;
	  }
	  freenode = nn;
	}
      } else {
	/* Statement 3 is true, so need to consider all types of key. */
	while ((nn = nextnode(freenode))) {
	  if (!tvisnil(&nn->val) && hashkey(t, &nn->key) == n) {
	  rechain:
	    freenode->next = nn->next;
	    nn->next = n->next;
	    setmref(n->next, nn);
	    /*
	    ** Rechaining one node onto n creates a new dilemma: we now need
	    ** to rechain any nn which has main(nn) == n OR has main(nn) equal
	    ** to any node which has already been rechained. Furthermore, at
	    ** least one of n and n->next will have a string key, so all types
	    ** of nn key need to be considered. Rather than testing whether
	    ** main(nn) definitely _is_ in the new chain, we test whether it
	    ** might _not_ be in the old chain, and if so re-link it into
	    ** the correct chain.
	    */
	    while ((nn = nextnode(freenode))) {
	      if (!tvisnil(&nn->val)) {
		Node *mn = hashkey(t, &nn->key);
		if (mn != freenode && mn != nn) {
		  freenode->next = nn->next;
		  nn->next = mn->next;
		  setmref(mn->next, nn);
		} else {
		  freenode = nn;
		}
	      } else {
		freenode = nn;
	      }
	    }
	    break;
	  } else {
	    freenode = nn;
	  }
	}
      }
    } else {  /* Otherwise use free node. */
      setmrefr(freenode->next, n->next);  /* Insert into chain. */
      setmref(n->next, freenode);
      n = freenode;
    }
  }
  n->key.u64 = key->u64;
  if (LJ_UNLIKELY(tvismzero(&n->key)))
    n->key.u64 = 0;
  lj_gc_anybarriert(L, t);
  lj_assertL(tvisnil(&n->val), "new hash slot is not empty");
  return &n->val;
}